

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O2

ErrorData * __thiscall
duckdb::TaskErrorManager::GetError(ErrorData *__return_storage_ptr__,TaskErrorManager *this)

{
  reference pvVar1;
  
  ::std::mutex::lock(&this->error_lock);
  pvVar1 = vector<duckdb::ErrorData,_true>::get<true>(&this->exceptions,0);
  ErrorData::ErrorData(__return_storage_ptr__,pvVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

ErrorData GetError() {
		lock_guard<mutex> elock(error_lock);
		D_ASSERT(!exceptions.empty());

		// FIXME: Should we try to get the biggest priority error?
		// In case the first exception is a StandardException but a regular Exception or a FatalException occurred
		// Maybe we should throw the more critical exception instead, as that changes behavior.
		auto &entry = exceptions[0];
		return entry;
	}